

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O0

Result_conflict *
isTrainingConfigurationSupported<CoreML::Specification::NeuralNetworkRegressor>
          (Result_conflict *__return_storage_ptr__,NeuralNetworkRegressor *nn)

{
  size_t *this;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  NetworkUpdateParameters *pNVar5;
  size_type sVar6;
  Optimizer *optimizer;
  LossLayer *this_00;
  string *psVar7;
  reference pvVar8;
  LayerNode *this_01;
  uchar (*pauVar9) [8];
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  undefined1 local_4a0 [8];
  string err_2;
  _Self local_470;
  _Self local_468;
  key_type local_460;
  LayerNode *parentNode;
  const_iterator __end3;
  const_iterator __begin3;
  vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_> *__range3;
  undefined1 local_400 [8];
  string err_1;
  LayerNode *currentNode;
  string currentNodeName;
  undefined1 local_370 [7];
  bool nonBackPropagableLayerSeen;
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  BFSQueue;
  LossLayer *lossLayer_1;
  undefined1 local_2f0 [4];
  int i_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  visitedLayersSet;
  undefined1 local_298 [40];
  Result local_270;
  LayerNode *nodePtr_1;
  LossLayer *local_1b0;
  LossLayer *lossLayer;
  reference pvStack_1a0;
  int i_1;
  LayerNode *nodePtr;
  NeuralNetworkLayer *local_108;
  NeuralNetworkLayer *layer;
  size_type sStack_f8;
  int i;
  size_t numberOfLayers;
  vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> layerNodes;
  NeuralNetworkValidatorGraph graph;
  undefined1 local_70 [8];
  string err;
  Result_conflict r;
  NeuralNetworkRegressor *nn_local;
  
  r._32_8_ = nn;
  CoreML::Result::Result((Result *)&stack0xffffffffffffffc0);
  pNVar5 = CoreML::Specification::NeuralNetworkRegressor::updateparams
                     ((NeuralNetworkRegressor *)r._32_8_);
  iVar3 = CoreML::Specification::NetworkUpdateParameters::losslayers_size(pNVar5);
  if (iVar3 < 2) {
    CoreML::NeuralNetworkValidatorGraph::NeuralNetworkValidatorGraph
              ((NeuralNetworkValidatorGraph *)
               &layerNodes.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::vector
              ((vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> *)&numberOfLayers);
    iVar3 = CoreML::Specification::NeuralNetworkRegressor::layers_size
                      ((NeuralNetworkRegressor *)r._32_8_);
    pNVar5 = CoreML::Specification::NeuralNetworkRegressor::updateparams
                       ((NeuralNetworkRegressor *)r._32_8_);
    iVar4 = CoreML::Specification::NetworkUpdateParameters::losslayers_size(pNVar5);
    sStack_f8 = (long)iVar3 + (long)iVar4;
    std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::resize
              ((vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> *)&numberOfLayers,
               sStack_f8);
    for (layer._4_4_ = 0; iVar3 = layer._4_4_,
        iVar4 = CoreML::Specification::NeuralNetworkRegressor::layers_size
                          ((NeuralNetworkRegressor *)r._32_8_), iVar3 < iVar4;
        layer._4_4_ = layer._4_4_ + 1) {
      local_108 = CoreML::Specification::NeuralNetworkRegressor::layers
                            ((NeuralNetworkRegressor *)r._32_8_,layer._4_4_);
      CoreML::LayerNode::LayerNode((LayerNode *)&nodePtr,local_108);
      std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::push_back
                ((vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> *)&numberOfLayers,
                 (value_type *)&nodePtr);
      CoreML::LayerNode::~LayerNode((LayerNode *)&nodePtr);
      sVar6 = std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::size
                        ((vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> *)
                         &numberOfLayers);
      pvStack_1a0 = std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::operator[]
                              ((vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> *)
                               &numberOfLayers,sVar6 - 1);
      CoreML::NeuralNetworkValidatorGraph::insertNode
                ((NeuralNetworkValidatorGraph *)
                 &layerNodes.
                  super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,pvStack_1a0);
    }
    lossLayer._4_4_ = 0;
    while( true ) {
      iVar3 = lossLayer._4_4_;
      pNVar5 = CoreML::Specification::NeuralNetworkRegressor::updateparams
                         ((NeuralNetworkRegressor *)r._32_8_);
      iVar4 = CoreML::Specification::NetworkUpdateParameters::losslayers_size(pNVar5);
      if (iVar4 <= iVar3) break;
      pNVar5 = CoreML::Specification::NeuralNetworkRegressor::updateparams
                         ((NeuralNetworkRegressor *)r._32_8_);
      local_1b0 = CoreML::Specification::NetworkUpdateParameters::losslayers(pNVar5,lossLayer._4_4_)
      ;
      CoreML::LayerNode::LayerNode((LayerNode *)&nodePtr_1,local_1b0);
      std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::push_back
                ((vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> *)&numberOfLayers,
                 (value_type *)&nodePtr_1);
      CoreML::LayerNode::~LayerNode((LayerNode *)&nodePtr_1);
      sVar6 = std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::size
                        ((vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> *)
                         &numberOfLayers);
      local_270.m_message._M_storage._M_storage =
           (uchar  [8])
           std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::operator[]
                     ((vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> *)
                      &numberOfLayers,sVar6 - 1);
      CoreML::NeuralNetworkValidatorGraph::insertNode
                ((NeuralNetworkValidatorGraph *)
                 &layerNodes.
                  super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (LayerNode *)local_270.m_message._M_storage._M_storage);
      validateLossLayer((Result_conflict *)(local_298 + 0x28),local_1b0,
                        (NeuralNetworkValidatorGraph *)
                        &layerNodes.
                         super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      CoreML::Result::operator=((Result *)&stack0xffffffffffffffc0,(Result *)(local_298 + 0x28));
      CoreML::Result::~Result((Result *)(local_298 + 0x28));
      bVar1 = CoreML::Result::good((Result *)&stack0xffffffffffffffc0);
      if (!bVar1) {
        CoreML::Result::Result((Result *)__return_storage_ptr__,(Result *)&stack0xffffffffffffffc0);
        goto LAB_00394ae4;
      }
      lossLayer._4_4_ = lossLayer._4_4_ + 1;
    }
    pNVar5 = CoreML::Specification::NeuralNetworkRegressor::updateparams
                       ((NeuralNetworkRegressor *)r._32_8_);
    optimizer = CoreML::Specification::NetworkUpdateParameters::optimizer(pNVar5);
    validateOptimizer((Result_conflict *)local_298,optimizer);
    CoreML::Result::operator=((Result *)&stack0xffffffffffffffc0,(Result *)local_298);
    CoreML::Result::~Result((Result *)local_298);
    bVar1 = CoreML::Result::good((Result *)&stack0xffffffffffffffc0);
    if (bVar1) {
      pNVar5 = CoreML::Specification::NeuralNetworkRegressor::updateparams
                         ((NeuralNetworkRegressor *)r._32_8_);
      validateOtherTopLevelUpdateParameters
                ((Result_conflict *)
                 &visitedLayersSet._M_t._M_impl.super__Rb_tree_header._M_node_count,pNVar5);
      this = &visitedLayersSet._M_t._M_impl.super__Rb_tree_header._M_node_count;
      CoreML::Result::operator=((Result *)&stack0xffffffffffffffc0,(Result *)this);
      CoreML::Result::~Result((Result *)this);
      bVar1 = CoreML::Result::good((Result *)&stack0xffffffffffffffc0);
      if (bVar1) {
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2f0);
        lossLayer_1._4_4_ = 0;
        while( true ) {
          pNVar5 = CoreML::Specification::NeuralNetworkRegressor::updateparams
                             ((NeuralNetworkRegressor *)r._32_8_);
          iVar3 = CoreML::Specification::NetworkUpdateParameters::losslayers_size(pNVar5);
          if (iVar3 <= lossLayer_1._4_4_) break;
          pNVar5 = CoreML::Specification::NeuralNetworkRegressor::updateparams
                             ((NeuralNetworkRegressor *)r._32_8_);
          this_00 = CoreML::Specification::NetworkUpdateParameters::losslayers
                              (pNVar5,lossLayer_1._4_4_);
          psVar7 = CoreML::Specification::LossLayer::name_abi_cxx11_(this_00);
          std::__cxx11::string::string
                    ((string *)
                     &BFSQueue.c.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node,(string *)psVar7);
          std::
          queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::queue<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
                    ((queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)local_370);
          std::
          queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_370,
                 (value_type *)
                 &BFSQueue.c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node);
          bVar1 = false;
          std::__cxx11::string::string((string *)&currentNodeName.super__Rb_tree_node_base._M_right)
          ;
          do {
            bVar2 = std::
                    queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::empty((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_370);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              graph.blobNameToProducingNode._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
                   0;
              break;
            }
            pvVar8 = std::
                     queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::front((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_370);
            std::__cxx11::string::string((string *)&currentNode,(string *)pvVar8);
            std::
            queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::pop((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_370);
            std::__cxx11::string::string
                      ((string *)&err_1.super__Rb_tree_node_base._M_right,(string *)&currentNode);
            this_01 = CoreML::NeuralNetworkValidatorGraph::getNodeFromName
                                ((NeuralNetworkValidatorGraph *)
                                 &layerNodes.
                                  super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (string *)&err_1.super__Rb_tree_node_base._M_right);
            std::__cxx11::string::~string((string *)&err_1.super__Rb_tree_node_base._M_right);
            if (this_01 == (LayerNode *)0x0) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &__range3,"Failed to look up node for \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &currentNode);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_400,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &__range3,"\'.");
              std::__cxx11::string::~string((string *)&__range3);
              CoreML::Result::Result
                        ((Result *)__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                         (string *)local_400);
              graph.blobNameToProducingNode._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
                   1;
              std::__cxx11::string::~string((string *)local_400);
            }
            else {
              __end3 = std::vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>::begin
                                 (&this_01->parents);
              parentNode = (LayerNode *)
                           std::vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>::
                           end(&this_01->parents);
              while (bVar2 = __gnu_cxx::operator!=
                                       (&__end3,(__normal_iterator<CoreML::LayerNode_*const_*,_std::vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>_>
                                                 *)&parentNode), bVar2) {
                pauVar9 = (uchar (*) [8])
                          __gnu_cxx::
                          __normal_iterator<CoreML::LayerNode_*const_*,_std::vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>_>
                          ::operator*(&__end3);
                local_460._M_storage._M_storage = *pauVar9;
                std::__cxx11::string::string
                          ((string *)&local_460,
                           (string *)((long)local_460._M_storage._M_storage + 0x38));
                local_468._M_node =
                     (_Base_ptr)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2f0,&local_460);
                local_470._M_node =
                     (_Base_ptr)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2f0);
                bVar2 = std::operator!=(&local_468,&local_470);
                if (bVar2) {
                  graph.blobNameToProducingNode._M_t._M_impl.super__Rb_tree_header._M_node_count.
                  _4_4_ = 0xe;
                }
                else {
                  pVar10 = std::
                           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_2f0,&local_460);
                  err_2.super__Rb_tree_node_base._M_right = (_Base_ptr)pVar10.first._M_node;
                  err_2._M_storage._M_storage[0] = pVar10.second;
                  std::
                  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::push((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_370,&local_460);
                  if (((*(bool *)((long)local_460._M_storage._M_storage + 0x88) & 1U) == 0) ||
                     (!bVar1)) {
                    if ((*(bool *)((long)local_460._M_storage._M_storage + 0x89) & 1U) == 0) {
                      if ((*(LayerCase *)((long)local_460._M_storage._M_storage + 0x30) == kSoftmax)
                         && (this_01->lossLayerType == kCategoricalCrossEntropyLossLayer)) {
                        graph.blobNameToProducingNode._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count._4_4_ = 0xe;
                        goto LAB_003949c9;
                      }
                      bVar1 = true;
                      std::__cxx11::string::operator=
                                ((string *)&currentNodeName.super__Rb_tree_node_base._M_right,
                                 (string *)((long)local_460._M_storage._M_storage + 0x38));
                    }
                    graph.blobNameToProducingNode._M_t._M_impl.super__Rb_tree_header._M_node_count.
                    _4_4_ = 0;
                  }
                  else {
                    std::__cxx11::string::string((string *)local_4a0);
                    std::operator+(&local_4e0,"There is a layer (",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&currentNodeName.super__Rb_tree_node_base._M_right);
                    std::operator+(&local_4c0,&local_4e0,
                                   "), which does not support backpropagation, between an updatable marked layer and the loss function."
                                  );
                    std::__cxx11::string::operator=((string *)local_4a0,(string *)&local_4c0);
                    std::__cxx11::string::~string((string *)&local_4c0);
                    std::__cxx11::string::~string((string *)&local_4e0);
                    CoreML::Result::Result
                              ((Result *)__return_storage_ptr__,
                               INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_4a0);
                    graph.blobNameToProducingNode._M_t._M_impl.super__Rb_tree_header._M_node_count.
                    _4_4_ = 1;
                    std::__cxx11::string::~string((string *)local_4a0);
                  }
                }
LAB_003949c9:
                std::__cxx11::string::~string((string *)&local_460);
                if ((graph.blobNameToProducingNode._M_t._M_impl.super__Rb_tree_header._M_node_count.
                     _4_4_ != 0) &&
                   (graph.blobNameToProducingNode._M_t._M_impl.super__Rb_tree_header._M_node_count.
                    _4_4_ != 0xe)) goto LAB_00394a19;
                __gnu_cxx::
                __normal_iterator<CoreML::LayerNode_*const_*,_std::vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>_>
                ::operator++(&__end3);
              }
              graph.blobNameToProducingNode._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
                   0;
            }
LAB_00394a19:
            std::__cxx11::string::~string((string *)&currentNode);
          } while (graph.blobNameToProducingNode._M_t._M_impl.super__Rb_tree_header._M_node_count.
                   _4_4_ == 0);
          std::__cxx11::string::~string
                    ((string *)&currentNodeName.super__Rb_tree_node_base._M_right);
          std::
          queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~queue((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_370);
          std::__cxx11::string::~string
                    ((string *)
                     &BFSQueue.c.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node);
          if (graph.blobNameToProducingNode._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
              != 0) goto LAB_00394ac8;
          lossLayer_1._4_4_ = lossLayer_1._4_4_ + 1;
        }
        CoreML::Result::Result((Result *)__return_storage_ptr__,(Result *)&stack0xffffffffffffffc0);
LAB_00394ac8:
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2f0);
      }
      else {
        CoreML::Result::Result((Result *)__return_storage_ptr__,(Result *)&stack0xffffffffffffffc0);
      }
    }
    else {
      CoreML::Result::Result((Result *)__return_storage_ptr__,(Result *)&stack0xffffffffffffffc0);
    }
LAB_00394ae4:
    std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::~vector
              ((vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> *)&numberOfLayers);
    CoreML::NeuralNetworkValidatorGraph::~NeuralNetworkValidatorGraph
              ((NeuralNetworkValidatorGraph *)
               &layerNodes.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    std::__cxx11::string::string((string *)local_70);
    std::__cxx11::string::operator=
              ((string *)local_70,
               "This model has more than one loss layers specified, which is not supported at the moment."
              );
    CoreML::Result::Result
              ((Result *)__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
               (string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
  }
  CoreML::Result::~Result((Result *)&stack0xffffffffffffffc0);
  return __return_storage_ptr__;
}

Assistant:

static Result isTrainingConfigurationSupported(const T& nn) {
    Result r;
    
    if (nn.updateparams().losslayers_size() > 1) {
        std::string err;
        err = "This model has more than one loss layers specified, which is not supported at the moment.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }
    
    NeuralNetworkValidatorGraph graph;
    std::vector<LayerNode> layerNodes;  // Holds on to all the nodes until the validation is over.
    
    // Make sure the layerNodes is large enough to hold all the elements
    size_t numberOfLayers = (size_t)nn.layers_size() + (size_t)nn.updateparams().losslayers_size();
    layerNodes.resize(numberOfLayers);
    
    /* first traverse "nn" and build the graph object
     */
    for (int i = 0; i < nn.layers_size(); i++) {
        const Specification::NeuralNetworkLayer* layer = &nn.layers(i);
        layerNodes.push_back(LayerNode(layer));
        LayerNode *nodePtr = &(layerNodes[layerNodes.size() - 1]);
        graph.insertNode(nodePtr);
    }
    for (int i = 0; i < nn.updateparams().losslayers_size(); i++) {
        const Specification::LossLayer* lossLayer = &nn.updateparams().losslayers(i);
        layerNodes.push_back(LayerNode(lossLayer));
        LayerNode *nodePtr = &(layerNodes[layerNodes.size() - 1]);
        graph.insertNode(nodePtr);
        r = validateLossLayer(lossLayer, &graph);
        if (!r.good()) {return r;}
    }
    
    r = validateOptimizer(nn.updateparams().optimizer());
    if (!r.good()) {return r;}

    r = validateOtherTopLevelUpdateParameters(nn.updateparams());
    if (!r.good()) {return r;}
    
    /* Now we check the following, by doing a BFS starting from the loss layers:
     - All the layers on the route from the loss layers to the updatable layers must support back-propagation
     */
    
    std::set<std::string> visitedLayersSet;
    
    for (int i = 0; i < nn.updateparams().losslayers_size(); i++) {
        const Specification::LossLayer& lossLayer = nn.updateparams().losslayers(i);
        std::string lossLayerName = lossLayer.name();
        
        // queue for BFS
        std::queue<std::string> BFSQueue;
        BFSQueue.push(lossLayerName);
        
        bool nonBackPropagableLayerSeen = false;
        
        std::string firstNonBackpropogabaleLayerSeen;
        
        while(!BFSQueue.empty()) {
            std::string currentNodeName = BFSQueue.front();
            BFSQueue.pop();
            const auto *currentNode = graph.getNodeFromName(currentNodeName);
            if (currentNode == NULL) {
                std::string err = "Failed to look up node for '" + currentNodeName + "'.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            // we are traversing the graph in reverse
            for (const auto *parentNode: currentNode->parents) {
                std::string parentName = parentNode->name;
                if (visitedLayersSet.find(parentName) != visitedLayersSet.end()) {
                    continue;
                }
                visitedLayersSet.insert(parentName);
                BFSQueue.push(parentName);
                
                // check if this "parentNode" is marked as updatable
                if (parentNode->isUpdatable) {
                    if (nonBackPropagableLayerSeen) {
                        // if this is true, it means an updatable node exists beyond a non-backpropagable layer
                        std::string err;
                        err = "There is a layer (" + firstNonBackpropogabaleLayerSeen + "), which does not support backpropagation, between an updatable marked layer and the loss function.";
                        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
                    }
                }
                
                // check if this "parentNode" is a non-backpropagable layer
                if (!parentNode->isBackPropagable) {
                    // softmax is a nonBackPropagableLayer. However, It is valid config if it is attached to a kCategoricalCrossEntropyLossLayer layer.
                    if ((parentNode->layerType == Specification::NeuralNetworkLayer::kSoftmax) && (currentNode->lossLayerType == Specification::LossLayer::kCategoricalCrossEntropyLossLayer)) {
                        continue;
                    }
                    nonBackPropagableLayerSeen = true;
                    firstNonBackpropogabaleLayerSeen = parentNode->name;
                }
            }
        }
    }
    
    return r;
    
}